

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O1

size_t vbytefse::encode(uint32_t *in_ptr,size_t in_size_u32,uint8_t *out_ptr,size_t out_size_u8,
                       uint8_t *buf)

{
  size_t srcSize;
  size_t sVar1;
  
  srcSize = vbyte::encode(in_ptr,in_size_u32,buf,out_size_u8,(uint8_t *)0x0);
  *(int *)out_ptr = (int)srcSize;
  sVar1 = FSE_compress(out_ptr + 4,out_size_u8 - 4,buf,srcSize);
  if (sVar1 == 0) {
    out_ptr[0] = '\0';
    out_ptr[1] = '\0';
    out_ptr[2] = '\0';
    out_ptr[3] = '\0';
    memcpy(out_ptr + 4,buf,srcSize);
    sVar1 = srcSize;
  }
  return sVar1 + 4;
}

Assistant:

static size_t encode(const uint32_t* in_ptr, size_t in_size_u32,
        uint8_t* out_ptr, size_t out_size_u8, uint8_t* buf = NULL)
    {
        size_t vbyte_bytes
            = vbyte::encode(in_ptr, in_size_u32, buf, out_size_u8);
        auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_ptr);
        *out_ptr_u32 = vbyte_bytes;
        auto stored_bytes = FSE_compress(out_ptr + sizeof(uint32_t),
            out_size_u8 - sizeof(uint32_t), buf, vbyte_bytes);
        if (stored_bytes == 0) {
            *out_ptr_u32 = 0;
            memcpy(out_ptr + sizeof(uint32_t), buf, vbyte_bytes);
            return vbyte_bytes + sizeof(uint32_t);
        } else {
            return stored_bytes + sizeof(uint32_t);
        }
    }